

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproto.c
# Opt level: O1

void * pool_alloc(pool *p,size_t sz)

{
  chunk *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = sz + 7 & 0xfffffffffffffff8;
  if (sz < 0x3e1) {
    if (p->current == (chunk *)0x0) {
      pcVar1 = (chunk *)malloc(0x3f0);
      if (pcVar1 == (chunk *)0x0) {
        return (void *)0x0;
      }
      pcVar1->next = p->header;
      p->header = pcVar1;
      p->current = pcVar1;
    }
    uVar2 = (ulong)p->current_used;
    if (uVar3 + uVar2 < 0x3e9) {
      p->current_used = (int)(uVar3 + uVar2);
      return (void *)((long)&p->current[1].next + uVar2);
    }
    if (uVar3 < uVar2) {
      pcVar1 = (chunk *)malloc(0x3f0);
      if (pcVar1 == (chunk *)0x0) {
        pcVar1 = (chunk *)0x0;
      }
      else {
        pcVar1->next = p->header;
        p->header = pcVar1;
        pcVar1 = pcVar1 + 1;
      }
      p->current = p->header;
      p->current_used = (int)uVar3;
      return pcVar1;
    }
  }
  pcVar1 = (chunk *)malloc(uVar3 + 8);
  if (pcVar1 == (chunk *)0x0) {
    return (void *)0x0;
  }
  pcVar1->next = p->header;
  p->header = pcVar1;
  return pcVar1 + 1;
}

Assistant:

static void *
pool_alloc(struct pool *p, size_t sz) {
	// align by 8
	sz = (sz + 7) & ~7;
	if (sz >= CHUNK_SIZE) {
		return pool_newchunk(p, sz);
	}
	if (p->current == NULL) {
		if (pool_newchunk(p, CHUNK_SIZE) == NULL)
			return NULL;
		p->current = p->header;
	}
	if (sz + p->current_used <= CHUNK_SIZE) {
		void * ret = (char *)(p->current+1) + p->current_used;
		p->current_used += sz;
		return ret;
	}

	if (sz >= p->current_used) {
		return pool_newchunk(p, sz);
	} else {
		void * ret = pool_newchunk(p, CHUNK_SIZE);
		p->current = p->header;
		p->current_used = sz;
		return ret;
	}
}